

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void maxHeapsort(HighsInt *heap_v,HighsInt *heap_i,HighsInt n)

{
  HighsInt HVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)n;
  while (1 < (int)uVar2) {
    HVar1 = heap_v[uVar2];
    heap_v[uVar2] = heap_v[1];
    heap_v[1] = HVar1;
    HVar1 = heap_i[uVar2];
    heap_i[uVar2] = heap_i[1];
    heap_i[1] = HVar1;
    uVar2 = uVar2 - 1;
    maxHeapify(heap_v,heap_i,1,(HighsInt)uVar2);
  }
  return;
}

Assistant:

void maxHeapsort(HighsInt* heap_v, HighsInt* heap_i, HighsInt n) {
  HighsInt temp_v;
  HighsInt i, temp_i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    temp_i = heap_i[i];
    heap_i[i] = heap_i[1];
    heap_i[1] = temp_i;
    maxHeapify(heap_v, heap_i, 1, i - 1);
  }
}